

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char * kj::_::fill<kj::String,kj::StringPtr&,kj::ArrayPtr<char_const>>
                 (char *target,String *first,StringPtr *rest,ArrayPtr<const_char> *rest_1)

{
  char *__src;
  size_t sVar1;
  size_t __n;
  char *pcVar2;
  
  __src = (first->content).ptr;
  sVar1 = (first->content).size_;
  pcVar2 = __src + (sVar1 - 1);
  if (sVar1 == 0) {
    pcVar2 = (char *)0x0;
    __src = (char *)0x0;
  }
  if (__src != pcVar2) {
    memcpy(target,__src,(long)pcVar2 - (long)__src);
    target = target + ((long)pcVar2 - (long)__src);
  }
  pcVar2 = (rest->content).ptr;
  sVar1 = (rest->content).size_;
  if (pcVar2 != pcVar2 + (sVar1 - 1)) {
    memcpy(target,pcVar2,sVar1 - 1);
    target = target + (sVar1 - 1);
  }
  __n = rest_1->size_;
  if (__n != 0) {
    memcpy(target,rest_1->ptr,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}